

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O2

TX_SIZE set_lpf_parameters(AV1_DEBLOCKING_PARAMETERS *params,ptrdiff_t mode_step,AV1_COMMON *cm,
                          MACROBLOCKD *xd,EDGE_DIR edge_dir,uint32_t x,uint32_t y,int plane,
                          macroblockd_plane *plane_ptr)

{
  loop_filter_info_n *lfi_n;
  BLOCK_SIZE BVar1;
  uint subsampling_y;
  uint subsampling_x;
  MB_MODE_INFO **ppMVar2;
  MB_MODE_INFO *mbmi;
  MB_MODE_INFO *mbmi_00;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  uint8_t uVar9;
  int *piVar10;
  int iVar11;
  uint8_t *puVar12;
  uint uVar13;
  int iVar14;
  byte bVar15;
  uint uVar16;
  long lVar17;
  
  params->filter_length = '\0';
  if ((x < (uint)(plane_ptr->dst).width) && (y < (uint)(plane_ptr->dst).height)) {
    subsampling_y = plane_ptr->subsampling_y;
    subsampling_x = plane_ptr->subsampling_x;
    uVar16 = (y << ((byte)subsampling_y & 0x1f)) >> 2 | subsampling_y;
    uVar13 = (x << ((byte)subsampling_x & 0x1f)) >> 2 | subsampling_x;
    lVar17 = (long)(int)uVar16 * (long)(cm->mi_params).mi_stride;
    ppMVar2 = (cm->mi_params).mi_grid_base;
    mbmi = ppMVar2[lVar17 + (int)uVar13];
    bVar15 = 0xff;
    if (mbmi != (MB_MODE_INFO *)0x0) {
      if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&mbmi->field_0xa7 & 7] == 0)) {
        if (plane == 0) {
          bVar5 = mbmi->tx_size;
          if ((((mbmi->field_0xa7 & 0x80) != 0) || ('\0' < mbmi->ref_frame[0])) &&
             (mbmi->skip_txfm == '\0')) {
            BVar1 = mbmi->bsize;
            bVar5 = mbmi->inter_tx_size
                    [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                            [BVar1] - 1 & uVar13) >>
                     (av1_get_txb_size_index_tw_w_log2_table[BVar1] & 0x1f)) +
                     (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                             [BVar1] - 1 & uVar16) >>
                      (av1_get_txb_size_index_tw_h_log2_table[BVar1] & 0x1f)) <<
                     (av1_get_txb_size_index_stride_log2_table[BVar1] & 0x1f))];
          }
        }
        else {
          bVar5 = av1_get_max_uv_txsize(mbmi->bsize,subsampling_x,subsampling_y);
        }
      }
      else {
        bVar5 = 0;
      }
      if (edge_dir == '\0') {
        y = x;
      }
      piVar10 = tx_size_high;
      if (edge_dir == '\0') {
        piVar10 = tx_size_wide;
      }
      bVar15 = bVar5;
      if ((piVar10[bVar5] - 1U & y) == 0) {
        lfi_n = &cm->lf_info;
        bVar6 = get_filter_level(cm,lfi_n,(uint)edge_dir,plane,mbmi);
        if (mbmi->skip_txfm == '\0') {
          bVar3 = false;
        }
        else {
          bVar3 = true;
          if ((mbmi->field_0xa7 & 0x80) == 0) {
            bVar3 = '\0' < mbmi->ref_frame[0];
          }
        }
        if ((y != 0) &&
           (mbmi_00 = ppMVar2[lVar17 + ((int)uVar13 - mode_step)], bVar15 = 0xff,
           mbmi_00 != (MB_MODE_INFO *)0x0)) {
          iVar11 = -1 << ((byte)subsampling_y & 0x1f);
          iVar14 = -1 << ((byte)subsampling_x & 0x1f);
          if (edge_dir == '\0') {
            iVar11 = 0;
          }
          else {
            iVar14 = 0;
          }
          if ((xd == (MACROBLOCKD *)0x0) || (xd->lossless[*(ushort *)&mbmi_00->field_0xa7 & 7] == 0)
             ) {
            if (plane == 0) {
              bVar7 = mbmi_00->tx_size;
              if ((((mbmi_00->field_0xa7 & 0x80) != 0) || ('\0' < mbmi_00->ref_frame[0])) &&
                 (mbmi_00->skip_txfm == '\0')) {
                BVar1 = mbmi_00->bsize;
                bVar7 = mbmi_00->inter_tx_size
                        [((int)("\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                [BVar1] - 1 & uVar13 + iVar14) >>
                         (av1_get_txb_size_index_tw_w_log2_table[BVar1] & 0x1f)) +
                         (((int)("\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                 [BVar1] - 1 & uVar16 + iVar11) >>
                          (av1_get_txb_size_index_tw_h_log2_table[BVar1] & 0x1f)) <<
                         (av1_get_txb_size_index_stride_log2_table[BVar1] & 0x1f))];
              }
            }
            else {
              bVar7 = av1_get_max_uv_txsize(mbmi_00->bsize,subsampling_x,subsampling_y);
            }
          }
          else {
            bVar7 = 0;
          }
          bVar8 = get_filter_level(cm,lfi_n,(uint)edge_dir,plane,mbmi_00);
          if (mbmi_00->skip_txfm == '\0') {
            bVar4 = false;
          }
          else {
            bVar4 = true;
            if ((mbmi_00->field_0xa7 & 0x80) == 0) {
              bVar4 = '\0' < mbmi_00->ref_frame[0];
            }
          }
          bVar15 = bVar5;
          if (bVar6 != 0 || bVar8 != 0) {
            puVar12 = block_size_high;
            if (edge_dir == '\0') {
              puVar12 = block_size_wide;
            }
            if ((!(bool)(bVar4 & bVar3)) ||
               ((puVar12[av1_ss_size_lookup[mbmi->bsize][(int)subsampling_x][(int)subsampling_y]] -
                 1 & y) == 0)) {
              piVar10 = tx_size_high_unit_log2;
              if (edge_dir == '\0') {
                piVar10 = tx_size_wide_unit_log2;
              }
              iVar11 = piVar10[bVar7];
              if (piVar10[bVar5] < piVar10[bVar7]) {
                iVar11 = piVar10[bVar5];
              }
              if (plane == 0) {
                uVar9 = (uint8_t)tx_dim_to_filter_length[iVar11];
              }
              else {
                uVar9 = (iVar11 != 0) * '\x02' + '\x04';
              }
              params->filter_length = uVar9;
              if (uVar9 != '\0') {
                if (bVar6 != 0) {
                  bVar8 = bVar6;
                }
                params->lfthr = lfi_n->lfthr + bVar8;
              }
            }
          }
        }
      }
    }
  }
  else {
    bVar15 = 0;
  }
  return bVar15;
}

Assistant:

static TX_SIZE set_lpf_parameters(
    AV1_DEBLOCKING_PARAMETERS *const params, const ptrdiff_t mode_step,
    const AV1_COMMON *const cm, const MACROBLOCKD *const xd,
    const EDGE_DIR edge_dir, const uint32_t x, const uint32_t y,
    const int plane, const struct macroblockd_plane *const plane_ptr) {
  // reset to initial values
  params->filter_length = 0;

  // no deblocking is required
  const uint32_t width = plane_ptr->dst.width;
  const uint32_t height = plane_ptr->dst.height;
  if ((width <= x) || (height <= y)) {
    // just return the smallest transform unit size
    return TX_4X4;
  }

  const uint32_t scale_horz = plane_ptr->subsampling_x;
  const uint32_t scale_vert = plane_ptr->subsampling_y;
  // for sub8x8 block, chroma prediction mode is obtained from the bottom/right
  // mi structure of the co-located 8x8 luma block. so for chroma plane, mi_row
  // and mi_col should map to the bottom/right mi structure, i.e, both mi_row
  // and mi_col should be odd number for chroma plane.
  const int mi_row = scale_vert | ((y << scale_vert) >> MI_SIZE_LOG2);
  const int mi_col = scale_horz | ((x << scale_horz) >> MI_SIZE_LOG2);
  MB_MODE_INFO **mi =
      cm->mi_params.mi_grid_base + mi_row * cm->mi_params.mi_stride + mi_col;
  const MB_MODE_INFO *mbmi = mi[0];
  // If current mbmi is not correctly setup, return an invalid value to stop
  // filtering. One example is that if this tile is not coded, then its mbmi
  // it not set up.
  if (mbmi == NULL) return TX_INVALID;

  const TX_SIZE ts = get_transform_size(xd, mi[0], mi_row, mi_col, plane,
                                        scale_horz, scale_vert);

  {
    const uint32_t coord = (VERT_EDGE == edge_dir) ? (x) : (y);
    const uint32_t transform_masks =
        edge_dir == VERT_EDGE ? tx_size_wide[ts] - 1 : tx_size_high[ts] - 1;
    const int32_t tu_edge = (coord & transform_masks) ? (0) : (1);

    if (!tu_edge) return ts;

    // prepare outer edge parameters. deblock the edge if it's an edge of a TU
    {
      const uint32_t curr_level =
          get_filter_level(cm, &cm->lf_info, edge_dir, plane, mbmi);
      const int curr_skipped = mbmi->skip_txfm && is_inter_block(mbmi);
      uint32_t level = curr_level;
      if (coord) {
        {
          const MB_MODE_INFO *const mi_prev = *(mi - mode_step);
          if (mi_prev == NULL) return TX_INVALID;
          const int pv_row =
              (VERT_EDGE == edge_dir) ? (mi_row) : (mi_row - (1 << scale_vert));
          const int pv_col =
              (VERT_EDGE == edge_dir) ? (mi_col - (1 << scale_horz)) : (mi_col);
          const TX_SIZE pv_ts = get_transform_size(
              xd, mi_prev, pv_row, pv_col, plane, scale_horz, scale_vert);

          const uint32_t pv_lvl =
              get_filter_level(cm, &cm->lf_info, edge_dir, plane, mi_prev);

          const int pv_skip_txfm =
              mi_prev->skip_txfm && is_inter_block(mi_prev);
          const BLOCK_SIZE bsize = get_plane_block_size(
              mbmi->bsize, plane_ptr->subsampling_x, plane_ptr->subsampling_y);
          assert(bsize < BLOCK_SIZES_ALL);
          const int prediction_masks = edge_dir == VERT_EDGE
                                           ? block_size_wide[bsize] - 1
                                           : block_size_high[bsize] - 1;
          const int32_t pu_edge = !(coord & prediction_masks);
          // if the current and the previous blocks are skipped,
          // deblock the edge if the edge belongs to a PU's edge only.
          if ((curr_level || pv_lvl) &&
              (!pv_skip_txfm || !curr_skipped || pu_edge)) {
            const int dim = (VERT_EDGE == edge_dir)
                                ? AOMMIN(tx_size_wide_unit_log2[ts],
                                         tx_size_wide_unit_log2[pv_ts])
                                : AOMMIN(tx_size_high_unit_log2[ts],
                                         tx_size_high_unit_log2[pv_ts]);
            if (plane) {
              params->filter_length = (dim == 0) ? 4 : 6;
            } else {
              assert(dim < TX_SIZES);
              assert(dim >= 0);
              params->filter_length = tx_dim_to_filter_length[dim];
            }

            // update the level if the current block is skipped,
            // but the previous one is not
            level = (curr_level) ? (curr_level) : (pv_lvl);
          }
        }
      }
      // prepare common parameters
      if (params->filter_length) {
        const loop_filter_thresh *const limits = cm->lf_info.lfthr + level;
        params->lfthr = limits;
      }
    }
  }

  return ts;
}